

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

char tag_options_item(menu_conflict *menu,wchar_t oid)

{
  ulong uVar1;
  size_t line;
  wchar_t oid_local;
  menu_conflict *menu_local;
  
  uVar1 = (ulong)oid;
  if (uVar1 < 0xf) {
    menu_local._7_1_ = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[oid];
  }
  else if (uVar1 == 0xf) {
    menu_local._7_1_ = '\0';
  }
  else if (uVar1 - 0x10 < 3) {
    menu_local._7_1_ = extra_item_options[uVar1 - 0x10].tag;
  }
  else {
    menu_local._7_1_ = '\0';
  }
  return menu_local._7_1_;
}

Assistant:

static char tag_options_item(struct menu *menu, int oid)
{
	size_t line = (size_t) oid;

	if (line < N_ELEMENTS(sval_dependent))
		return all_letters_nohjkl[oid];

	/* Separator - blank line. */
	if (line == N_ELEMENTS(sval_dependent))
		return 0;

	line = line - N_ELEMENTS(sval_dependent) - 1;

	if (line < N_ELEMENTS(extra_item_options))
		return extra_item_options[line].tag;

	return 0;
}